

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  string *psVar9;
  reference pbVar10;
  cmProcess *pcVar11;
  double testTimeOut;
  double timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  string local_718 [32];
  ostringstream local_6f8 [8];
  ostringstream cmCTestLog_msg_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string local_558 [32];
  undefined1 local_538 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_3c0 [8];
  string file;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_398;
  iterator i;
  undefined1 local_370 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1f8 [8];
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  int local_1b0;
  int local_19c;
  undefined1 local_198 [8];
  ostringstream cmCTestLog_msg;
  size_t total_local;
  cmCTestRunTest *this_local;
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  iVar3 = getNumWidth(total);
  local_19c = (int)std::setw(iVar3 * 2 + 8);
  poVar4 = std::operator<<((ostream *)local_198,(_Setw)local_19c);
  poVar4 = std::operator<<(poVar4,"Start ");
  iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
  iVar3 = getNumWidth((long)iVar3);
  local_1b0 = (int)std::setw(iVar3);
  poVar4 = std::operator<<(poVar4,(_Setw)local_1b0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1bf,pcVar5,false);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  ComputeArguments(this);
  msg.field_2._8_8_ = &this->TestProperties->Args;
  (this->TestResult).Properties = this->TestProperties;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Failed to start");
  (this->TestResult).Status = 8;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::operator=((string *)&this->TestResult,(string *)this->TestProperties);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::operator=((string *)&(this->TestResult).Path,pcVar5);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)msg.field_2._8_8_);
  if (1 < sVar6) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)msg.field_2._8_8_,1);
    bVar2 = std::operator==(pvVar7,"NOT_AVAILABLE");
    if (bVar2) {
      pcVar11 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar11);
      this->TestProcess = pcVar11;
      std::__cxx11::string::string(local_1f8);
      cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::operator=(local_1f8,"Test not available in configuration \"");
        psVar9 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
        std::__cxx11::string::operator+=(local_1f8,(string *)psVar9);
        std::__cxx11::string::operator+=(local_1f8,"\".");
      }
      else {
        std::__cxx11::string::operator=(local_1f8,"Test not available without configuration.");
        std::__cxx11::string::operator+=(local_1f8,"  (Missing \"-C <config>\"?)");
      }
      poVar4 = std::operator<<(this->TestHandler->LogFile,local_1f8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
      poVar4 = std::operator<<((ostream *)local_370,local_1f8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x1dc,pcVar5,false);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_1f8);
      std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
      std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Not Run");
      (this->TestResult).Status = 0;
      this_local._7_1_ = 0;
      std::__cxx11::string::~string(local_1f8);
      goto LAB_0059aa32;
    }
  }
  local_398._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->TestProperties->RequiredFiles);
  while( true ) {
    file.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->TestProperties->RequiredFiles);
    bVar2 = __gnu_cxx::operator!=
                      (&local_398,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&file.field_2 + 8));
    if (!bVar2) break;
    pbVar10 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_398);
    std::__cxx11::string::string((string *)local_3c0,(string *)pbVar10);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar5);
    if (!bVar2) {
      pcVar11 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar11);
      this->TestProcess = pcVar11;
      poVar4 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
      poVar4 = std::operator<<(poVar4,(string *)local_3c0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
      poVar4 = std::operator<<((ostream *)local_538,"Unable to find required file: ");
      poVar4 = std::operator<<(poVar4,(string *)local_3c0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x1f2,pcVar5,false);
      std::__cxx11::string::~string(local_558);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
      std::operator+(&local_578,"Unable to find required file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
      ;
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
      std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Not Run");
      (this->TestResult).Status = 0;
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_3c0);
    if (!bVar2) goto LAB_0059aa32;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_398);
  }
  bVar2 = std::operator==(&this->ActualCommand,"");
  if (bVar2) {
    pcVar11 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar11);
    this->TestProcess = pcVar11;
    poVar4 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)msg.field_2._8_8_,1);
    poVar4 = std::operator<<(poVar4,(string *)pvVar7);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::ostringstream(local_6f8);
    poVar4 = std::operator<<((ostream *)local_6f8,"Unable to find executable: ");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)msg.field_2._8_8_,1);
    poVar4 = std::operator<<(poVar4,(string *)pvVar7);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x203,pcVar5,false);
    std::__cxx11::string::~string(local_718);
    std::__cxx11::ostringstream::~ostringstream(local_6f8);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)msg.field_2._8_8_,1);
    std::operator+(&local_738,"Unable to find executable: ",pvVar7);
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_738);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
    std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Not Run");
    (this->TestResult).Status = 0;
    this_local._7_1_ = 0;
  }
  else {
    cmCTest::CurrentTime_abi_cxx11_((string *)&timeout,this->CTest);
    std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&timeout);
    std::__cxx11::string::~string((string *)&timeout);
    testTimeOut = ResolveTimeout(this);
    if ((this->StopTimePassed & 1U) == 0) {
      this_local._7_1_ =
           ForkProcess(this,testTimeOut,(bool)(this->TestProperties->ExplicitTimeout & 1),
                       &this->TestProperties->Environment);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_0059aa32:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2*getNumWidth(total) + 8)
    << "Start "
    << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
    << this->TestProperties->Index << ": "
    << this->TestProperties->Name << std::endl);
  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory.c_str();

  if(args.size() >= 2 && args[1] == "NOT_AVAILABLE")
    {
    this->TestProcess = new cmProcess;
    std::string msg;
    if(this->CTest->GetConfigType().empty())
      {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
      }
    else
      {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
      }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }

  // Check if all required files exist
  for(std::vector<std::string>::iterator i =
    this->TestProperties->RequiredFiles.begin();
    i != this->TestProperties->RequiredFiles.end(); ++i)
    {
    std::string file = *i;

    if(!cmSystemTools::FileExists(file.c_str()))
      {
      //Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: "
               << file << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find required file: "
               << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Not Run";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
      }
    }
  // log and return if we did not find the executable
  if (this->ActualCommand == "")
    {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: "
                   << args[1] << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find executable: "
               << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if(this->StopTimePassed)
    {
    return false;
    }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}